

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O3

void __thiscall Assimp::STLExporter::WriteMeshBinary(STLExporter *this,aiMesh *m)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  aiVector3D *paVar4;
  ulong uVar5;
  aiFace *paVar6;
  float fVar7;
  char dummy [2];
  float vz;
  float vy;
  float nz;
  float ny;
  float nx;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  aiMesh *local_40;
  ulong local_38;
  
  if (m->mNumFaces != 0) {
    local_38 = 0;
    local_40 = m;
    do {
      paVar6 = m->mFaces + local_38;
      paVar4 = m->mNormals;
      if (paVar4 == (aiVector3D *)0x0) {
        local_44 = 0.0;
        local_48 = 0.0;
        local_4c = 0.0;
      }
      else {
        if ((ulong)paVar6->mNumIndices == 0) {
          local_44 = 0.0;
          fVar7 = 0.0;
          local_4c = 0.0;
        }
        else {
          local_44 = 0.0;
          fVar7 = 0.0;
          local_4c = 0.0;
          uVar5 = 0;
          do {
            uVar1 = paVar4[paVar6->mIndices[uVar5]].x;
            uVar2 = paVar4[paVar6->mIndices[uVar5]].y;
            local_44 = local_44 + (float)uVar1;
            fVar7 = fVar7 + (float)uVar2;
            local_4c = local_4c + paVar4[paVar6->mIndices[uVar5]].z;
            uVar5 = uVar5 + 1;
          } while (paVar6->mNumIndices != uVar5);
        }
        local_48 = 1.0 / SQRT(local_4c * local_4c + local_44 * local_44 + fVar7 * fVar7);
        local_4c = local_4c * local_48;
        local_44 = local_48 * local_44;
        local_48 = local_48 * fVar7;
      }
      std::ostream::write((char *)this,(long)&local_44);
      std::ostream::write((char *)this,(long)&local_48);
      std::ostream::write((char *)this,(long)&local_4c);
      m = local_40;
      if (paVar6->mNumIndices != 0) {
        uVar5 = 0;
        do {
          paVar4 = m->mVertices;
          uVar3 = paVar6->mIndices[uVar5];
          local_58 = paVar4[uVar3].x;
          local_50 = paVar4[uVar3].y;
          local_54 = paVar4[uVar3].z;
          std::ostream::write((char *)this,(long)&local_58);
          std::ostream::write((char *)this,(long)&local_50);
          std::ostream::write((char *)this,(long)&local_54);
          uVar5 = uVar5 + 1;
        } while (uVar5 < paVar6->mNumIndices);
      }
      local_58 = (float)((uint)local_58 & 0xffff0000);
      std::ostream::write((char *)this,(long)&local_58);
      local_38 = local_38 + 1;
    } while (local_38 < m->mNumFaces);
  }
  return;
}

Assistant:

void STLExporter::WriteMeshBinary(const aiMesh* m)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];
        // we need per-face normals. We specified aiProcess_GenNormals as pre-requisite for this exporter,
        // but nonetheless we have to expect per-vertex normals.
        aiVector3D nor;
        if (m->mNormals) {
            for(unsigned int a = 0; a < f.mNumIndices; ++a) {
                nor += m->mNormals[f.mIndices[a]];
            }
            nor.Normalize();
        }
        // STL binary files use 4-byte floats. This may possibly cause loss of precision
        // for clients using 8-byte doubles
        float nx = (float) nor.x;
        float ny = (float) nor.y;
        float nz = (float) nor.z;
        AI_SWAP4(nx); AI_SWAP4(ny); AI_SWAP4(nz);
        mOutput.write((char *)&nx, 4); mOutput.write((char *)&ny, 4); mOutput.write((char *)&nz, 4);
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const aiVector3D& v  = m->mVertices[f.mIndices[a]];
            float vx = (float) v.x, vy = (float) v.y, vz = (float) v.z;
            AI_SWAP4(vx); AI_SWAP4(vy); AI_SWAP4(vz);
            mOutput.write((char *)&vx, 4); mOutput.write((char *)&vy, 4); mOutput.write((char *)&vz, 4);
        }
        char dummy[2] = {0};
        mOutput.write(dummy, 2);
    }
}